

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp_conn.cpp
# Opt level: O1

void __thiscall TcpConnection::add_task(TcpConnection *this)

{
  int fd;
  EventLoop *pEVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  Logger *pLVar3;
  undefined8 local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_50;
  _Any_data local_48;
  code *local_38;
  code *pcStack_30;
  
  pLVar3 = Logger::get_instance();
  if ((pLVar3->l_inited == false) && (-1 < pr_level)) {
    printf("[%-5s][%s:%d] logger must be inited before user!\n","error","add_task",0x1b);
  }
  if (1 < (int)g_log_level) {
    pLVar3 = Logger::get_instance();
    Logger::write_log(pLVar3,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/AlberTTreblA[P]HighPerformanceConcurrentServer/net/tcp_conn.cpp"
                      ,"add_task",0x1b,LOG_LEVEL_INFO,
                      "tcp connection add connected task to poller, conn fd is %d\n",this->tc_fd);
    pLVar3 = Logger::get_instance();
    Logger::flush(pLVar3);
  }
  pEVar1 = this->tc_loop;
  std::__shared_ptr<TcpConnection,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<TcpConnection,void>
            ((__shared_ptr<TcpConnection,(__gnu_cxx::_Lock_policy)2> *)&local_58,
             (__weak_ptr<TcpConnection,_(__gnu_cxx::_Lock_policy)2> *)this);
  local_38 = (code *)0x0;
  pcStack_30 = (code *)0x0;
  local_48._M_unused._M_object = (void *)0x0;
  local_48._8_8_ = 0;
  local_48._M_unused._M_object = operator_new(0x10);
  p_Var2 = local_50;
  *(undefined8 *)local_48._M_unused._0_8_ = local_58;
  *(undefined8 *)((long)local_48._M_unused._0_8_ + 8) = 0;
  local_50 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)local_48._M_unused._0_8_ + 8) = p_Var2;
  local_58 = 0;
  pcStack_30 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/AlberTTreblA[P]HighPerformanceConcurrentServer/net/tcp_conn.cpp:28:23)>
               ::_M_invoke;
  local_38 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/AlberTTreblA[P]HighPerformanceConcurrentServer/net/tcp_conn.cpp:28:23)>
             ::_M_manager;
  EventLoop::add_task(pEVar1,(Task *)&local_48);
  if (local_38 != (code *)0x0) {
    (*local_38)(&local_48,&local_48,__destroy_functor);
  }
  if (local_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_50);
  }
  pLVar3 = Logger::get_instance();
  if ((pLVar3->l_inited == false) && (-1 < pr_level)) {
    printf("[%-5s][%s:%d] logger must be inited before user!\n","error","add_task",0x1d);
  }
  if (1 < (int)g_log_level) {
    pLVar3 = Logger::get_instance();
    Logger::write_log(pLVar3,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/AlberTTreblA[P]HighPerformanceConcurrentServer/net/tcp_conn.cpp"
                      ,"add_task",0x1d,LOG_LEVEL_INFO,
                      "tcp connection add do read to poller, conn fd is %d\n",this->tc_fd);
    pLVar3 = Logger::get_instance();
    Logger::flush(pLVar3);
  }
  pEVar1 = this->tc_loop;
  fd = this->tc_fd;
  std::__shared_ptr<TcpConnection,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<TcpConnection,void>
            ((__shared_ptr<TcpConnection,(__gnu_cxx::_Lock_policy)2> *)&local_58,
             (__weak_ptr<TcpConnection,_(__gnu_cxx::_Lock_policy)2> *)this);
  local_38 = (code *)0x0;
  pcStack_30 = (code *)0x0;
  local_48._M_unused._M_object = (void *)0x0;
  local_48._8_8_ = 0;
  local_48._M_unused._M_object = operator_new(0x10);
  p_Var2 = local_50;
  *(undefined8 *)local_48._M_unused._0_8_ = local_58;
  *(undefined8 *)((long)local_48._M_unused._0_8_ + 8) = 0;
  local_50 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)local_48._M_unused._0_8_ + 8) = p_Var2;
  local_58 = 0;
  pcStack_30 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/AlberTTreblA[P]HighPerformanceConcurrentServer/net/tcp_conn.cpp:30:44)>
               ::_M_invoke;
  local_38 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/AlberTTreblA[P]HighPerformanceConcurrentServer/net/tcp_conn.cpp:30:44)>
             ::_M_manager;
  Epoll::epoll_add((pEVar1->el_epoller).super___shared_ptr<Epoll,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                   ,fd,1,(EventCallback *)&local_48);
  if (local_38 != (code *)0x0) {
    (*local_38)(&local_48,&local_48,__destroy_functor);
  }
  if (local_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_50);
  }
  return;
}

Assistant:

void TcpConnection::add_task() {
LOG_INFO("tcp connection add connected task to poller, conn fd is %d\n", tc_fd);
    tc_loop->add_task([shared_this=shared_from_this()](){ shared_this->connected(); });
LOG_INFO("tcp connection add do read to poller, conn fd is %d\n", tc_fd);
    tc_loop->add_to_poller(tc_fd, EPOLLIN, [shared_this=shared_from_this()](){ shared_this->do_read(); });
}